

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_confined.cpp
# Opt level: O1

Reals __thiscall
Omega_h::get_edge_pad_dists<3>(Omega_h *this,Mesh *mesh,Read<signed_char> *edges_are_bridges)

{
  int *piVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  Alloc *pAVar3;
  LO LVar4;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  void *pvVar5;
  Reals RVar6;
  Write<double> out;
  type f;
  LOs edges2verts;
  Reals coords;
  Write<double> local_a8;
  Write<double> local_98;
  type local_88;
  Alloc *local_48;
  element_type *local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  element_type *local_30;
  
  Mesh::coords((Mesh *)&local_38);
  Mesh::ask_verts_of((Mesh *)&local_48,(Int)mesh);
  LVar4 = Mesh::nedges(mesh);
  local_88.edges_are_bridges.write_.shared_alloc_.alloc = (Alloc *)&local_88.edges2verts;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"");
  Write<double>::Write(&local_a8,LVar4,-1.0,(string *)&local_88);
  if (local_88.edges_are_bridges.write_.shared_alloc_.alloc != (Alloc *)&local_88.edges2verts) {
    operator_delete(local_88.edges_are_bridges.write_.shared_alloc_.alloc,
                    (ulong)((long)&(local_88.edges2verts.write_.shared_alloc_.alloc)->size + 1));
  }
  local_88.edges_are_bridges.write_.shared_alloc_.alloc =
       (edges_are_bridges->write_).shared_alloc_.alloc;
  if (((ulong)local_88.edges_are_bridges.write_.shared_alloc_.alloc & 7) == 0 &&
      local_88.edges_are_bridges.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_88.edges_are_bridges.write_.shared_alloc_.alloc =
           (Alloc *)((local_88.edges_are_bridges.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_88.edges_are_bridges.write_.shared_alloc_.alloc)->use_count =
           (local_88.edges_are_bridges.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_88.edges_are_bridges.write_.shared_alloc_.direct_ptr =
       (edges_are_bridges->write_).shared_alloc_.direct_ptr;
  local_88.edges2verts.write_.shared_alloc_.alloc = local_48;
  if (((ulong)local_48 & 7) == 0 && local_48 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_88.edges2verts.write_.shared_alloc_.alloc = (Alloc *)(local_48->size * 8 + 1);
    }
    else {
      local_48->use_count = local_48->use_count + 1;
    }
  }
  local_88.edges2verts.write_.shared_alloc_.direct_ptr = local_40;
  local_88.coords.write_.shared_alloc_.alloc = (Alloc *)local_38._M_pi;
  if (((ulong)local_38._M_pi & 7) == 0 && (Alloc *)local_38._M_pi != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_88.coords.write_.shared_alloc_.alloc =
           (Alloc *)((long)(local_38._M_pi)->_vptr__Sp_counted_base * 8 + 1);
    }
    else {
      *(int *)&local_38._M_pi[3]._vptr__Sp_counted_base =
           *(int *)&local_38._M_pi[3]._vptr__Sp_counted_base + 1;
    }
  }
  local_88.coords.write_.shared_alloc_.direct_ptr = local_30;
  local_88.out.shared_alloc_.alloc = local_a8.shared_alloc_.alloc;
  if (((ulong)local_a8.shared_alloc_.alloc & 7) == 0 && local_a8.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    if (entering_parallel == '\x01') {
      local_88.out.shared_alloc_.alloc = (Alloc *)((local_a8.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_a8.shared_alloc_.alloc)->use_count = (local_a8.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_88.out.shared_alloc_.direct_ptr = local_a8.shared_alloc_.direct_ptr;
  LVar4 = Mesh::nedges(mesh);
  parallel_for<Omega_h::get_edge_pad_dists<3>(Omega_h::Mesh*,Omega_h::Read<signed_char>)::_lambda(int)_1_&>
            (LVar4,&local_88);
  local_98.shared_alloc_.alloc = local_a8.shared_alloc_.alloc;
  local_98.shared_alloc_.direct_ptr = local_a8.shared_alloc_.direct_ptr;
  if ((((ulong)local_a8.shared_alloc_.alloc & 7) == 0 &&
       local_a8.shared_alloc_.alloc != (Alloc *)0x0) && (entering_parallel == '\x01')) {
    (local_a8.shared_alloc_.alloc)->use_count = (local_a8.shared_alloc_.alloc)->use_count + -1;
    local_98.shared_alloc_.alloc = (Alloc *)((local_a8.shared_alloc_.alloc)->size * 8 + 1);
  }
  local_a8.shared_alloc_.alloc = (Alloc *)0x0;
  local_a8.shared_alloc_.direct_ptr = (void *)0x0;
  Read<double>::Read((Read<signed_char> *)this,&local_98);
  pAVar3 = local_98.shared_alloc_.alloc;
  if (((ulong)local_98.shared_alloc_.alloc & 7) == 0 && local_98.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    piVar1 = &(local_98.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_98.shared_alloc_.alloc);
      operator_delete(pAVar3,0x48);
    }
  }
  get_edge_pad_dists<3>(Omega_h::Mesh*,Omega_h::Read<signed_char>)::{lambda(int)#1}::~Mesh
            ((_lambda_int__1_ *)&local_88);
  pAVar3 = local_a8.shared_alloc_.alloc;
  pvVar5 = extraout_RDX;
  if (((ulong)local_a8.shared_alloc_.alloc & 7) == 0 && local_a8.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    piVar1 = &(local_a8.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_a8.shared_alloc_.alloc);
      operator_delete(pAVar3,0x48);
      pvVar5 = extraout_RDX_00;
    }
  }
  if (((ulong)local_48 & 7) == 0 && local_48 != (Alloc *)0x0) {
    piVar1 = &local_48->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_48);
      operator_delete(local_48,0x48);
      pvVar5 = extraout_RDX_01;
    }
  }
  if (((ulong)local_38._M_pi & 7) == 0 && (Alloc *)local_38._M_pi != (Alloc *)0x0) {
    p_Var2 = local_38._M_pi + 3;
    *(int *)&p_Var2->_vptr__Sp_counted_base = *(int *)&p_Var2->_vptr__Sp_counted_base + -1;
    if (*(int *)&p_Var2->_vptr__Sp_counted_base == 0) {
      Alloc::~Alloc((Alloc *)local_38._M_pi);
      operator_delete(local_38._M_pi,0x48);
      pvVar5 = extraout_RDX_02;
    }
  }
  RVar6.write_.shared_alloc_.direct_ptr = pvVar5;
  RVar6.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Reals)RVar6.write_.shared_alloc_;
}

Assistant:

Reals get_edge_pad_dists(Mesh* mesh, Read<I8> edges_are_bridges) {
  auto coords = mesh->coords();
  auto edges2verts = mesh->ask_verts_of(EDGE);
  auto out = Write<Real>(mesh->nedges(), -1.0);
  auto f = OMEGA_H_LAMBDA(LO edge) {
    if (!edges_are_bridges[edge]) return;
    auto eev2v = gather_verts<2>(edges2verts, edge);
    auto eev2x = gather_vectors<2, dim>(coords, eev2v);
    auto h = norm(eev2x[1] - eev2x[0]);
    out[edge] = h;
  };
  parallel_for(mesh->nedges(), f);
  return out;
}